

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void __thiscall
ncnn::Mat::create(Mat *this,int _w,int _h,int _c,size_t _elemsize,int _elempack,
                 Allocator *_allocator)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  void *pvVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  Mat *in_RDI;
  size_t in_R8;
  int in_R9D;
  size_t totalsize;
  Mat *in_stack_ffffffffffffffd0;
  
  if ((((in_RDI->dims != 3) || (in_RDI->w != in_ESI)) || (in_RDI->h != in_EDX)) ||
     (((in_RDI->c != in_ECX || (in_RDI->elemsize != in_R8)) ||
      ((in_RDI->elempack != in_R9D || (in_RDI->allocator != (Allocator *)totalsize)))))) {
    release(in_stack_ffffffffffffffd0);
    in_RDI->elemsize = in_R8;
    in_RDI->elempack = in_R9D;
    in_RDI->allocator = (Allocator *)totalsize;
    in_RDI->dims = 3;
    in_RDI->w = in_ESI;
    in_RDI->h = in_EDX;
    in_RDI->d = 1;
    in_RDI->c = in_ECX;
    sVar2 = ncnn::alignSize((long)in_RDI->w * (long)in_RDI->h * in_RDI->elemsize,0x10);
    in_RDI->cstep = sVar2 / in_RDI->elemsize;
    sVar2 = total(in_RDI);
    if (sVar2 != 0) {
      sVar2 = total(in_RDI);
      sVar2 = ncnn::alignSize(sVar2 * in_RDI->elemsize,4);
      if (in_RDI->allocator == (Allocator *)0x0) {
        pvVar3 = fastMalloc(sVar2);
        in_RDI->data = pvVar3;
      }
      else {
        iVar1 = (*in_RDI->allocator->_vptr_Allocator[2])(in_RDI->allocator,sVar2 + 4);
        in_RDI->data = (void *)CONCAT44(extraout_var,iVar1);
      }
      in_RDI->refcount = (int *)((long)in_RDI->data + sVar2);
      *in_RDI->refcount = 1;
    }
  }
  return;
}

Assistant:

void Mat::create(int _w, int _h, int _c, size_t _elemsize, int _elempack, Allocator* _allocator)
{
    if (dims == 3 && w == _w && h == _h && c == _c && elemsize == _elemsize && elempack == _elempack && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = _elempack;
    allocator = _allocator;

    dims = 3;
    w = _w;
    h = _h;
    d = 1;
    c = _c;

    cstep = alignSize((size_t)w * h * elemsize, 16) / elemsize;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}